

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void jmp_append(FuncState *fs,BCPos *l1,BCPos l2)

{
  BCPos BVar1;
  BCPos local_20;
  BCPos next;
  BCPos list;
  BCPos l2_local;
  BCPos *l1_local;
  FuncState *fs_local;
  
  if (l2 != 0xffffffff) {
    if (*l1 == 0xffffffff) {
      *l1 = l2;
    }
    else {
      BVar1 = *l1;
      do {
        local_20 = BVar1;
        BVar1 = jmp_next(fs,local_20);
      } while (BVar1 != 0xffffffff);
      jmp_patchins(fs,local_20,l2);
    }
  }
  return;
}

Assistant:

static void jmp_append(FuncState *fs, BCPos *l1, BCPos l2)
{
  if (l2 == NO_JMP) {
    return;
  } else if (*l1 == NO_JMP) {
    *l1 = l2;
  } else {
    BCPos list = *l1;
    BCPos next;
    while ((next = jmp_next(fs, list)) != NO_JMP)  /* Find last element. */
      list = next;
    jmp_patchins(fs, list, l2);
  }
}